

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall TasGrid::GridGlobal::loadGpuValues<float>(GridGlobal *this)

{
  __uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
  __p;
  CudaGlobalData<float> *this_00;
  __uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
  local_20;
  
  this_00 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl;
  if (this_00 == (CudaGlobalData<float> *)0x0) {
    Utils::make_unique<TasGrid::CudaGlobalData<float>>();
    __p._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
    .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
         .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
    .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl =
         (tuple<TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
          )(_Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
            )0x0;
    ::std::
    __uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
             *)&this->gpu_cachef,
            (pointer)__p._M_t.
                     super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
                     .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl);
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
                   *)&local_20);
    this_00 = (this->gpu_cachef)._M_t.
              super___uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
              .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl;
  }
  if ((this_00->values).num_entries == 0) {
    GpuVector<float>::
    load<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              (&this_00->values,(this->super_BaseCanonicalGrid).acceleration,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (this->super_BaseCanonicalGrid).values.values.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                         )(this->super_BaseCanonicalGrid).values.values.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GridGlobal::loadGpuValues() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaGlobalData<T>>();
    if (ccache->values.empty()) ccache->values.load(acceleration, values.begin(), values.end());
}